

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_address.cpp
# Opt level: O0

void __thiscall miniros::network::NetAddress::NetAddress(NetAddress *this,NetAddress *other)

{
  void *__src;
  size_t sVar1;
  void *pvVar2;
  Type *in_RSI;
  Type *in_RDI;
  sockaddr_in *addr;
  size_t size;
  
  *in_RDI = AddressInvalid;
  std::__cxx11::string::string((string *)(in_RDI + 2));
  in_RDI[10] = AddressInvalid;
  in_RDI[0xc] = AddressInvalid;
  in_RDI[0xd] = AddressInvalid;
  if ((*(undefined8 *)(in_RSI + 0xc) == AddressInvalid) ||
     ((*in_RSI != AddressIPv4 && (*in_RSI != AddressIPv6)))) {
    *in_RDI = AddressInvalid;
  }
  else {
    sVar1 = getAddressSize(*in_RSI);
    pvVar2 = malloc(sVar1);
    *(void **)(in_RDI + 0xc) = pvVar2;
    pvVar2 = *(void **)(in_RDI + 0xc);
    __src = *(void **)(in_RSI + 0xc);
    sVar1 = getAddressSize(*in_RSI);
    memcpy(pvVar2,__src,sVar1);
    *in_RDI = *in_RSI;
  }
  in_RDI[10] = in_RSI[10];
  std::__cxx11::string::operator=((string *)(in_RDI + 2),(string *)(in_RSI + 2));
  return;
}

Assistant:

NetAddress::NetAddress(const NetAddress& other)
{
  if (other.rawAddress && (other.type == Type::AddressIPv4 || other.type == Type::AddressIPv6)) {
    size_t size = getAddressSize(other.type);
    sockaddr_in* addr = static_cast<sockaddr_in*>(malloc(size));
    rawAddress = addr;
    memcpy(rawAddress, other.rawAddress, getAddressSize(other.type));
    type = other.type;
  } else {
    type = Type::AddressInvalid;
  }
  port = other.port;
  address = other.address;
}